

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall
QPDFWriter::unparseObject
          (QPDFWriter *this,QPDFObjectHandle *object,int level,int flags,size_t stream_length,
          bool compress)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar3;
  variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  *__v;
  uint uVar4;
  size_type len;
  undefined8 uVar5;
  uint uVar6;
  char cVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  __index_type _Var11;
  qpdf_object_type_e qVar12;
  int iVar13;
  int iVar14;
  QPDFObjGen QVar15;
  uchar *key;
  Object *pOVar16;
  const_iterator cVar17;
  iterator iVar18;
  iterator iVar19;
  element_type *peVar20;
  string *psVar21;
  long *plVar22;
  RC4_KEY *key_00;
  QPDF_Dictionary *pQVar23;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar24;
  _Base_ptr p_Var25;
  logic_error *this_01;
  byte bVar26;
  uint uVar27;
  undefined4 in_register_0000000c;
  uint *indata;
  element_type *peVar28;
  size_t __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar29;
  ulong uVar30;
  string *psVar31;
  uint uVar32;
  uint uVar33;
  char cVar34;
  ulong uVar35;
  undefined8 uVar36;
  _Alloc_hider _Var37;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  undefined7 in_register_00000089;
  int iVar38;
  _Base_ptr p_Var39;
  bool bVar40;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar41;
  string val;
  QPDFObjectHandle filter;
  QPDFObjectHandle extensions;
  QPDFObjectHandle decode_parms;
  unique_ptr<char[],_std::default_delete<char[]>_> tmp_ph;
  RC4 rc4;
  string indent;
  Pl_Buffer bufpl;
  Pl_AES_PDF pl;
  QPDFObjectHandle item;
  QPDFObjectHandle adbe;
  string local_3c8;
  string *local_3a8;
  uint local_39c;
  string local_398;
  ulong local_370;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  uint local_314;
  QPDF_String local_310;
  string local_2f0;
  long *local_2d0;
  void *local_2c8;
  long local_2c0 [2];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [40];
  undefined1 local_278 [16];
  undefined1 local_268 [152];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string *local_1b0;
  QPDFObjectHandle local_1a8;
  undefined1 local_198 [16];
  string local_188;
  uint local_168;
  undefined4 local_164;
  undefined1 local_160 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  QPDFObjGen local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  undefined1 local_120 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  string local_f0;
  QPDFObjectHandle local_d0;
  QPDFObjectHandle local_c0;
  QPDFObjectHandle local_b0;
  QPDFObjectHandle local_a0;
  QPDFObjectHandle local_90;
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  
  indata = (uint *)CONCAT44(in_register_0000000c,flags);
  local_164 = (undefined4)CONCAT71(in_register_00000089,compress);
  local_3a8 = (string *)object;
  local_1b0 = (string *)stream_length;
  QVar15 = QPDFObjectHandle::getObjGen(object);
  local_370 = (ulong)(uint)level;
  if (level < 0) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"invalid level in QPDFWriter::unparseObject");
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_2d0 = local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0," ","");
  if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      qdf_mode == true) {
    uVar32 = (int)local_370 * 2;
    indata = (uint *)(ulong)uVar32;
    stream_length = 0x20;
    std::__cxx11::string::_M_replace_aux((ulong)&local_2d0,(ulong)local_2c8,0,(char)uVar32);
    *(undefined1 *)local_2d0 = 10;
  }
  qVar12 = QPDFObjectHandle::getTypeCode((QPDFObjectHandle *)local_3a8);
  psVar21 = local_3a8;
  if (qVar12 - ot_string < 5) {
    uVar32 = flags & 0xfffffffe;
    indata = &switchD_001ed52f::switchdataD_0028062c;
    iVar13 = QVar15.obj;
    switch(qVar12) {
    case ot_string:
      paVar29 = &local_398.field_2;
      local_398._M_string_length = 0;
      local_398.field_2._M_local_buf[0] = '\0';
      local_398._M_dataplus._M_p = (pointer)paVar29;
      if ((((flags & 0x14U) == 0) &&
          (peVar20 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr, peVar20->encrypted != false)) &&
         ((peVar20->cur_data_key)._M_string_length != 0)) {
        QPDFObjectHandle::getStringValue_abi_cxx11_
                  ((string *)local_278,(QPDFObjectHandle *)local_3a8);
        std::__cxx11::string::operator=((string *)&local_398,(string *)local_278);
        if ((element_type *)local_278._0_8_ != (element_type *)(local_278 + 0x10)) {
          operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
        }
        if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            encrypt_use_aes == true) {
          Pl_Buffer::Pl_Buffer((Pl_Buffer *)local_2b0,"encrypted string",(Pipeline *)0x0);
          key = QUtil::unsigned_char_pointer
                          (&((this->m).
                             super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->cur_data_key);
          indata = (uint *)0x1;
          Pl_AES_PDF::Pl_AES_PDF
                    ((Pl_AES_PDF *)local_278,"aes encrypt string",(Pipeline *)local_2b0,true,key,
                     (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->cur_data_key)._M_string_length);
          Pipeline::writeString((Pipeline *)local_278,&local_398);
          Pl_AES_PDF::finish((Pl_AES_PDF *)local_278);
          Pl_Buffer::getString_abi_cxx11_(&local_f0,(Pl_Buffer *)local_2b0);
          paVar1 = &local_310.val.field_2;
          paVar2 = &local_f0.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p == paVar2) {
            local_310.val.field_2._8_8_ = local_f0.field_2._8_8_;
            local_310.val._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_310.val._M_dataplus._M_p = local_f0._M_dataplus._M_p;
          }
          local_310.val.field_2._M_allocated_capacity._1_7_ =
               local_f0.field_2._M_allocated_capacity._1_7_;
          local_310.val.field_2._M_local_buf[0] = local_f0.field_2._M_local_buf[0];
          local_310.val._M_string_length = local_f0._M_string_length;
          local_f0._M_string_length._0_4_ = 0;
          local_f0._M_string_length._4_4_ = 0;
          local_f0.field_2._M_local_buf[0] = '\0';
          local_f0._M_dataplus._M_p = (pointer)paVar2;
          QPDF_String::unparse_abi_cxx11_(&local_2f0,&local_310,true);
          std::__cxx11::string::operator=((string *)&local_398,(string *)&local_2f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310.val._M_dataplus._M_p != paVar1) {
            operator_delete(local_310.val._M_dataplus._M_p,
                            local_310.val.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != paVar2) {
            operator_delete(local_f0._M_dataplus._M_p,
                            CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                     local_f0.field_2._M_local_buf[0]) + 1);
          }
          Pl_AES_PDF::~Pl_AES_PDF((Pl_AES_PDF *)local_278);
          Pl_Buffer::~Pl_Buffer((Pl_Buffer *)local_2b0);
        }
        else {
          QUtil::make_unique_cstr((QUtil *)&local_310,&local_398);
          _Var37._M_p = local_310.val._M_dataplus._M_p;
          len = local_398._M_string_length;
          key_00 = (RC4_KEY *)
                   QUtil::unsigned_char_pointer
                             (&((this->m).
                                super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->cur_data_key);
          uVar30 = (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->cur_data_key)._M_string_length;
          if ((uVar30 & 0xffffffff80000000) != 0) {
            QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar30);
          }
          RC4::RC4((RC4 *)&local_2f0,key_00,uVar30 & 0xffffffff,(uchar *)indata,
                   (uchar *)stream_length);
          indata = (uint *)QUtil::unsigned_char_pointer(_Var37._M_p);
          RC4::process((RC4 *)&local_2f0,(uchar *)indata,len,(uchar *)indata);
          local_130 = (QPDFObjGen)local_120;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,_Var37._M_p,_Var37._M_p + (long)(_func_int ***)len);
          if (local_130 == (QPDFObjGen)local_120) {
            local_2a0._8_8_ = local_120._8_8_;
            local_2b0._0_8_ = local_2a0;
          }
          else {
            local_2b0._0_4_ = local_130.obj;
            local_2b0._4_4_ = local_130.gen;
          }
          local_2a0._1_7_ = local_120._1_7_;
          local_2a0[0] = local_120[0];
          local_2b0._8_8_ = local_128;
          local_128 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_120[0] = 0;
          local_130 = (QPDFObjGen)local_120;
          QPDF_String::unparse_abi_cxx11_((string *)local_278,(QPDF_String *)local_2b0,false);
          std::__cxx11::string::operator=((string *)&local_398,(string *)local_278);
          if ((element_type *)local_278._0_8_ != (element_type *)(local_278 + 0x10)) {
            operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
          }
          if ((undefined1 *)local_2b0._0_8_ != local_2a0) {
            operator_delete((void *)local_2b0._0_8_,local_2a0._0_8_ + 1);
          }
          if (local_130 != (QPDFObjGen)local_120) {
            operator_delete((void *)local_130,CONCAT71(local_120._1_7_,local_120[0]) + 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._M_string_length);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310.val._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete__(local_310.val._M_dataplus._M_p);
          }
        }
      }
      else if ((flags & 8U) == 0) {
        QPDFObjectHandle::unparseResolved_abi_cxx11_
                  ((string *)local_278,(QPDFObjectHandle *)local_3a8);
        std::__cxx11::string::operator=((string *)&local_398,(string *)local_278);
        uVar30 = local_268._0_8_;
        peVar28 = (element_type *)local_278._0_8_;
        if ((element_type *)local_278._0_8_ != (element_type *)(local_278 + 0x10)) {
LAB_001ee5a6:
          operator_delete(peVar28,uVar30 + 1);
        }
      }
      else {
        QPDFObjectHandle::getStringValue_abi_cxx11_
                  ((string *)(local_120 + 0x10),(QPDFObjectHandle *)local_3a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._16_8_ == &local_100) {
          local_2a0._8_8_ = local_100._8_8_;
          local_2b0._0_8_ = local_2a0;
        }
        else {
          local_2b0._0_8_ = local_120._16_8_;
        }
        local_2a0._1_7_ = local_100._M_allocated_capacity._1_7_;
        local_2a0[0] = local_100._M_local_buf[0];
        local_2b0._8_8_ = local_120._24_8_;
        local_120._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_100._M_local_buf[0] = '\0';
        local_120._16_8_ = &local_100;
        QPDF_String::unparse_abi_cxx11_((string *)local_278,(QPDF_String *)local_2b0,true);
        std::__cxx11::string::operator=((string *)&local_398,(string *)local_278);
        if ((element_type *)local_278._0_8_ != (element_type *)(local_278 + 0x10)) {
          operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
        }
        if ((undefined1 *)local_2b0._0_8_ != local_2a0) {
          operator_delete((void *)local_2b0._0_8_,local_2a0._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._16_8_ != &local_100) {
          uVar30 = CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]);
          peVar28 = (element_type *)local_120._16_8_;
          goto LAB_001ee5a6;
        }
      }
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_398._M_dataplus._M_p,
                 (void *)local_398._M_string_length,(size_t)indata);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p == paVar29) goto LAB_001ef68b;
      uVar30 = CONCAT71(local_398.field_2._M_allocated_capacity._1_7_,
                        local_398.field_2._M_local_buf[0]);
      _Var37._M_p = local_398._M_dataplus._M_p;
      break;
    case ot_name:
      goto switchD_001ed52f_caseD_7;
    case ot_array:
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x280b84,(void *)0x1,0x28062c);
      local_278._0_8_ =
           (((BaseHandle *)&local_3a8->_M_dataplus)->obj).
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_278._8_8_ =
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_3a8->_M_string_length)->_M_pi;
      psVar21 = local_3a8;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        psVar21 = (string *)&__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count + 1;
        }
      }
      local_268._0_8_ = 0;
      iVar18 = ::qpdf::Array::begin((Array *)local_278);
      iVar19 = ::qpdf::Array::end((Array *)local_278);
      if (iVar18._M_current != iVar19._M_current) {
        local_370 = (ulong)((int)local_370 + 1);
        do {
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,(int)local_2d0,local_2c8,(size_t)psVar21);
          peVar20 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          if (peVar20->qdf_mode == true) {
            ::qpdf::pl::Count::write(peVar20->pipeline,0x27f2bc,(void *)0x2,(size_t)psVar21);
          }
          local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = ((iVar18._M_current)->super_BaseHandle).obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               ((iVar18._M_current)->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_90.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_90.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_90.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_90.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_90.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          psVar21 = (string *)(ulong)uVar32;
          unparseChild(this,&local_90,(int)local_370,uVar32);
          if (local_90.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          iVar18._M_current = iVar18._M_current + 1;
        } while (iVar18._M_current != iVar19._M_current);
      }
      std::
      unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
      ::~unique_ptr((unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                     *)(local_278 + 0x10));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
      }
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_2d0,local_2c8,(size_t)psVar21);
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x26c42c,(void *)0x1,(size_t)psVar21);
      goto LAB_001ef68b;
    case ot_dictionary:
      local_39c = flags;
      local_314 = uVar32;
      QPDFObjectHandle::unsafeShallowCopy((QPDFObjectHandle *)local_278);
      uVar5 = local_278._8_8_;
      uVar36 = local_278._0_8_;
      local_278._0_8_ = (element_type *)0x0;
      local_278._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar21->_M_string_length)->_M_pi;
      (((BaseHandle *)&psVar21->_M_dataplus)->obj).
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar36;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar21->_M_string_length)->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
      }
      peVar20 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      bVar9 = QVar15.gen == (peVar20->root_og).gen;
      bVar10 = iVar13 == (peVar20->root_og).obj;
      local_348._0_8_ = (element_type *)0x0;
      local_348._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (bVar9 && bVar10) {
        peVar28 = (element_type *)(local_278 + 0x10);
        local_278._0_8_ = peVar28;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"/Extensions","");
        bVar8 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_3a8,(string *)local_278);
        if (bVar8) {
          local_2b0._0_8_ = local_2a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"/Extensions","");
          QPDFObjectHandle::getKey(&local_40,local_3a8);
          bVar8 = QPDFObjectHandle::isDictionary(&local_40);
          if (local_40.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if ((undefined1 *)local_2b0._0_8_ != local_2a0) {
            operator_delete((void *)local_2b0._0_8_,local_2a0._0_8_ + 1);
          }
        }
        else {
          bVar8 = false;
        }
        if ((element_type *)local_278._0_8_ != peVar28) {
          operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
        }
        if (bVar8 != false) {
          local_278._0_8_ = peVar28;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"/Extensions","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_398,local_3a8);
          uVar36 = local_348._8_8_;
          local_348._8_8_ = local_398._M_string_length;
          local_348._0_8_ = local_398._M_dataplus._M_p;
          local_398._M_dataplus._M_p = (pointer)0x0;
          local_398._M_string_length = 0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar36 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar36);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._M_string_length);
          }
          if ((element_type *)local_278._0_8_ != peVar28) {
            operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
          }
        }
      }
      if ((element_type *)local_348._0_8_ == (element_type *)0x0) {
        bVar8 = false;
        bVar40 = false;
      }
      else {
        QPDFObjectHandle::getKeys_abi_cxx11_
                  ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_278,(QPDFObjectHandle *)local_348);
        paVar29 = &local_398.field_2;
        local_398._M_dataplus._M_p = (pointer)paVar29;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"/ADBE","");
        cVar17 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_278,&local_398);
        bVar8 = cVar17._M_node != (_Base_ptr)(local_278 + 8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != paVar29) {
          operator_delete(local_398._M_dataplus._M_p,
                          CONCAT71(local_398.field_2._M_allocated_capacity._1_7_,
                                   local_398.field_2._M_local_buf[0]) + 1);
        }
        if (cVar17._M_node != (_Base_ptr)(local_278 + 8)) {
          local_398._M_dataplus._M_p = (pointer)paVar29;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"/ADBE","");
          pVar41 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_278,&local_398);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_278,(_Base_ptr)pVar41.first._M_node,
                         (_Base_ptr)pVar41.second._M_node);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != paVar29) {
            operator_delete(local_398._M_dataplus._M_p,
                            CONCAT71(local_398.field_2._M_allocated_capacity._1_7_,
                                     local_398.field_2._M_local_buf[0]) + 1);
          }
        }
        bVar40 = (QPDFObjGen)local_268._24_8_ != (QPDFObjGen)0x0;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_278);
      }
      uVar32 = local_39c;
      iVar13 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->final_extension_level;
      if (bVar9 && bVar10) {
        if (iVar13 < 1) {
          if (!bVar40 && bVar8) {
            local_278._0_8_ = (element_type *)(local_278 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"/Extensions","");
            QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_3a8,(string *)local_278);
            if ((element_type *)local_278._0_8_ != (element_type *)(local_278 + 0x10)) {
              operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
            }
            uVar36 = local_348._8_8_;
            local_348._0_8_ = (element_type *)0x0;
            local_348._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar36 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar36);
            }
          }
        }
        else if (!bVar8 && !bVar40) {
          local_278._0_8_ = (element_type *)(local_278 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"/Extensions","");
          QPDFObjectHandle::newDictionary();
          indata = (uint *)&local_2f0;
          QPDFObjectHandle::replaceKeyAndGetNew
                    ((QPDFObjectHandle *)&local_398,local_3a8,(QPDFObjectHandle *)local_278);
          uVar36 = local_348._8_8_;
          local_348._8_8_ = local_398._M_string_length;
          local_348._0_8_ = local_398._M_dataplus._M_p;
          local_398._M_dataplus._M_p = (pointer)0x0;
          local_398._M_string_length = 0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar36 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar36);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._M_string_length);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._M_string_length);
          }
          if ((element_type *)local_278._0_8_ != (element_type *)(local_278 + 0x10)) {
            operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
          }
        }
      }
      if ((element_type *)local_348._0_8_ != (element_type *)0x0) {
        peVar28 = (element_type *)(local_278 + 0x10);
        local_278._0_8_ = peVar28;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"/ADBE","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_160,(string *)local_348);
        if ((element_type *)local_278._0_8_ != peVar28) {
          operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
        }
        bVar9 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_160);
        if (bVar9) {
          local_278._0_8_ = peVar28;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"/BaseVersion","");
          QPDFObjectHandle::getKey(&local_50,(string *)local_160);
          std::operator+(&local_398,"/",
                         &((this->m).
                           super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->final_pdf_version);
          bVar10 = QPDFObjectHandle::isNameAndEquals(&local_50,&local_398);
          if (!bVar10) goto LAB_001ee2a7;
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"/ExtensionLevel","")
          ;
          QPDFObjectHandle::getKey(&local_60,(string *)local_160);
          bVar10 = QPDFObjectHandle::isInteger(&local_60);
          if (!bVar10) {
            bVar10 = true;
            goto LAB_001ee2ac;
          }
          local_310.val._M_dataplus._M_p = (pointer)&local_310.val.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"/ExtensionLevel","")
          ;
          QPDFObjectHandle::getKey(&local_70,(string *)local_160);
          psVar21 = (string *)QPDFObjectHandle::getIntValue(&local_70);
          indata = (uint *)(long)((this->m).
                                  super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->final_extension_level;
          bVar40 = psVar21 == (string *)indata;
          bVar8 = true;
          bVar10 = true;
        }
        else {
LAB_001ee2a7:
          bVar10 = false;
LAB_001ee2ac:
          bVar8 = false;
          bVar40 = false;
        }
        if (bVar8) {
          if (local_70.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310.val._M_dataplus._M_p != &local_310.val.field_2) {
            operator_delete(local_310.val._M_dataplus._M_p,
                            local_310.val.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar10) {
          if (local_60.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_60.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar9) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,
                            CONCAT71(local_398.field_2._M_allocated_capacity._1_7_,
                                     local_398.field_2._M_local_buf[0]) + 1);
          }
          if (local_50.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if ((element_type *)local_278._0_8_ != peVar28) {
            operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
          }
        }
        uVar32 = local_39c;
        if (!bVar40) {
          if (iVar13 < 1) {
            local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"/ADBE","");
            QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_348,&local_3c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p == &local_3c8.field_2) goto LAB_001eeb36;
          }
          else {
            local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"/ADBE","");
            std::operator+(&local_1d0,"<< /BaseVersion /",
                           &((this->m).
                             super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->final_pdf_version);
            plVar22 = (long *)std::__cxx11::string::append((char *)&local_1d0);
            paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar22 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar22 == paVar29) {
              local_328._M_allocated_capacity = paVar29->_M_allocated_capacity;
              local_328._8_8_ = plVar22[3];
              local_348._16_8_ = &local_328;
            }
            else {
              local_328._M_allocated_capacity = paVar29->_M_allocated_capacity;
              local_348._16_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar22;
            }
            local_348._24_8_ = plVar22[1];
            *plVar22 = (long)paVar29;
            plVar22[1] = 0;
            *(undefined1 *)(plVar22 + 2) = 0;
            uVar32 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->final_extension_level;
            uVar4 = -uVar32;
            if (0 < (int)uVar32) {
              uVar4 = uVar32;
            }
            uVar33 = 1;
            if (9 < uVar4) {
              uVar30 = (ulong)uVar4;
              uVar6 = 4;
              do {
                uVar33 = uVar6;
                uVar27 = (uint)uVar30;
                if (uVar27 < 100) {
                  uVar33 = uVar33 - 2;
                  goto LAB_001ee895;
                }
                if (uVar27 < 1000) {
                  uVar33 = uVar33 - 1;
                  goto LAB_001ee895;
                }
                if (uVar27 < 10000) goto LAB_001ee895;
                uVar30 = uVar30 / 10000;
                uVar6 = uVar33 + 4;
              } while (99999 < uVar27);
              uVar33 = uVar33 + 1;
            }
LAB_001ee895:
            local_1a8.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_198;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_1a8,(char)uVar33 - (char)((int)uVar32 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((long)&((local_1a8.super_BaseHandle.obj.
                                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_ptr)->value).
                                       super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                       .
                                       super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                       .
                                       super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                       .
                                       super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                       .
                                       super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                       .
                                       super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               + (ulong)(uVar32 >> 0x1f)),uVar33,uVar4);
            uVar30 = (long)&(local_1a8.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + local_348._24_8_;
            uVar36 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._16_8_ != &local_328) {
              uVar36 = local_328._M_allocated_capacity;
            }
            if ((ulong)uVar36 < uVar30) {
              uVar35 = 0xf;
              if (local_1a8.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)local_198) {
                uVar35 = local_198._0_8_;
              }
              if (uVar35 < uVar30) goto LAB_001ee91f;
              plVar22 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_1a8,0,(char *)0x0,local_348._16_8_);
            }
            else {
LAB_001ee91f:
              plVar22 = (long *)std::__cxx11::string::_M_append
                                          (local_348 + 0x10,
                                           (ulong)local_1a8.super_BaseHandle.obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
            }
            local_368._0_8_ = local_358;
            peVar28 = (element_type *)(plVar22 + 2);
            if ((element_type *)*plVar22 == peVar28) {
              local_358._0_8_ =
                   *(undefined8 *)
                    &(peVar28->value).
                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              ;
              local_358._8_8_ = plVar22[3];
            }
            else {
              local_358._0_8_ =
                   *(undefined8 *)
                    &(peVar28->value).
                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              ;
              local_368._0_8_ = (element_type *)*plVar22;
            }
            local_368._8_8_ = plVar22[1];
            *plVar22 = (long)peVar28;
            plVar22[1] = 0;
            *(undefined1 *)
             &(peVar28->value).
              super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              .
              super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              .
              super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              .
              super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              .
              super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              .
              super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 = 0;
            plVar22 = (long *)std::__cxx11::string::append(local_368);
            indata = (uint *)(plVar22 + 2);
            if ((string *)*plVar22 == (string *)indata) {
              local_188.field_2._M_allocated_capacity =
                   (size_type)(((string *)indata)->_M_dataplus)._M_p;
              local_188.field_2._8_4_ = (undefined4)plVar22[3];
              local_188.field_2._12_4_ = *(undefined4 *)((long)plVar22 + 0x1c);
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            }
            else {
              local_188.field_2._M_allocated_capacity =
                   (size_type)(((string *)indata)->_M_dataplus)._M_p;
              local_188._M_dataplus._M_p = (pointer)*plVar22;
            }
            local_188._M_string_length = plVar22[1];
            *plVar22 = (long)indata;
            plVar22[1] = 0;
            *(undefined1 *)(plVar22 + 2) = 0;
            local_150._M_allocated_capacity = (size_type)&local_140;
            std::__cxx11::string::_M_construct<char_const*>((string *)(local_160 + 0x10),"");
            QPDFObjectHandle::parse(&local_80,&local_188,(string *)(local_160 + 0x10));
            QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_348,&local_3c8,&local_80);
            if (local_80.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_80.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_allocated_capacity != &local_140) {
              operator_delete((void *)local_150._M_allocated_capacity,
                              local_140._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,
                              (ulong)(local_188.field_2._M_allocated_capacity + 1));
            }
            if ((element_type *)local_368._0_8_ != (element_type *)local_358) {
              operator_delete((void *)local_368._0_8_,local_358._0_8_ + 1);
            }
            if (local_1a8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)local_198) {
              operator_delete(local_1a8.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              local_198._0_8_ + 1);
            }
            uVar32 = local_39c;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._16_8_ != &local_328) {
              operator_delete((void *)local_348._16_8_,local_328._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p == &local_3c8.field_2) goto LAB_001eeb36;
          }
          operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
        }
LAB_001eeb36:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_);
        }
      }
      if ((uVar32 & 1) != 0) {
        paVar29 = &local_3c8.field_2;
        local_3c8._M_dataplus._M_p = (pointer)paVar29;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"/Length","");
        QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_3a8,&local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != paVar29) {
          operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
        }
        local_3c8._M_dataplus._M_p = (pointer)paVar29;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"/DecodeParms","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_368,local_3a8);
        bVar9 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_368);
        if (bVar9) {
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"/DecodeParms","");
          QPDFObjectHandle::getKey(&local_1a8,local_3a8);
          iVar13 = QPDFObjectHandle::getArrayNItems(&local_1a8);
          bVar9 = iVar13 == 0;
          if (local_1a8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1a8.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,
                            (ulong)(local_188.field_2._M_allocated_capacity + 1));
          }
        }
        else {
          bVar9 = false;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != paVar29) {
          operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
        }
        if (bVar9) {
          local_3c8._M_dataplus._M_p = (pointer)paVar29;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"/DecodeParms","");
          QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_3a8,&local_3c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != paVar29) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
        }
        if ((uVar32 & 2) == 0) {
          local_3c8._M_dataplus._M_p = (pointer)paVar29;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"/Filter","");
          psVar21 = local_3a8;
          QPDFObjectHandle::getKey((QPDFObjectHandle *)local_368,local_3a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != paVar29) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
          local_3c8._M_dataplus._M_p = (pointer)paVar29;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"/DecodeParms","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_348 + 0x10),psVar21);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != paVar29) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
          local_3c8._M_dataplus._M_p = (pointer)paVar29;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"/Crypt","");
          bVar9 = QPDFObjectHandle::isOrHasName((QPDFObjectHandle *)local_368,&local_3c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != paVar29) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
          if (bVar9) {
            bVar9 = QPDFObjectHandle::isName((QPDFObjectHandle *)local_368);
            if (bVar9) {
              local_3c8._M_dataplus._M_p = (pointer)paVar29;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"/Filter","");
              QPDFObjectHandle::removeKey((QPDFObjectHandle *)psVar21,&local_3c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_dataplus._M_p != paVar29) {
                operator_delete(local_3c8._M_dataplus._M_p,
                                local_3c8.field_2._M_allocated_capacity + 1);
              }
              local_3c8._M_dataplus._M_p = (pointer)paVar29;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3c8,"/DecodeParms","");
              QPDFObjectHandle::removeKey((QPDFObjectHandle *)psVar21,&local_3c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_dataplus._M_p != paVar29) {
                operator_delete(local_3c8._M_dataplus._M_p,
                                local_3c8.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              iVar38 = 0;
              iVar13 = -1;
              do {
                iVar14 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_368);
                if (iVar14 <= iVar38) break;
                QPDFObjectHandle::getArrayItem
                          ((QPDFObjectHandle *)&local_1d0,(int)(QPDFObjectHandle *)local_368);
                local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"/Crypt","");
                bVar9 = QPDFObjectHandle::isNameAndEquals((QPDFObjectHandle *)&local_1d0,&local_3c8)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                  operator_delete(local_3c8._M_dataplus._M_p,
                                  local_3c8.field_2._M_allocated_capacity + 1);
                }
                if (bVar9) {
                  iVar13 = iVar38;
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_1d0._M_string_length);
                }
                iVar38 = iVar38 + 1;
              } while (!bVar9);
              if (-1 < iVar13) {
                QPDFObjectHandle::eraseItem((QPDFObjectHandle *)local_368,iVar13);
                QPDFObjectHandle::eraseItem((QPDFObjectHandle *)(local_348 + 0x10),iVar13);
              }
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._24_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._24_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
          }
        }
        else {
          local_3c8._M_dataplus._M_p = (pointer)paVar29;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"/Filter","");
          psVar21 = local_3a8;
          QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_3a8,&local_3c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != paVar29) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
          local_3c8._M_dataplus._M_p = (pointer)paVar29;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"/DecodeParms","");
          QPDFObjectHandle::removeKey((QPDFObjectHandle *)psVar21,&local_3c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != paVar29) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
        }
      }
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x280b6c,(void *)0x2,(size_t)indata);
      local_150._M_allocated_capacity =
           (size_type)
           (((BaseHandle *)&local_3a8->_M_dataplus)->obj).
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_150._8_8_ =
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_3a8->_M_string_length)->_M_pi;
      psVar21 = local_3a8;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        psVar21 = (string *)&__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_)->_M_use_count + 1;
        }
      }
      pQVar23 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)(local_160 + 0x10));
      if (pQVar23 == (QPDF_Dictionary *)0x0) {
        p_Var25 = (_Base_ptr)0x0;
      }
      else {
        p_Var25 = (pQVar23->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      pQVar23 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)(local_160 + 0x10));
      p_Var39 = &(pQVar23->items)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar23 == (QPDF_Dictionary *)0x0) {
        p_Var39 = (_Base_ptr)0x0;
      }
      if (p_Var25 != p_Var39) {
        local_370 = (ulong)((int)local_370 + 1);
        local_168 = local_314 | 0x18;
        do {
          __v = *(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  **)(p_Var25 + 2);
          if (__v != (variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      *)0x0) {
            _Var11 = (__v->
                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     ).
                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     ._M_index;
            if (_Var11 == '\x0f') {
              pvVar24 = std::
                        get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                                  (__v);
LAB_001ef0bd:
              _Var11 = *(__index_type *)
                        ((long)&(((pvVar24->obj).
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                                ->value).
                                super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                .
                                super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                .
                                super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                .
                                super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        + 0x30);
            }
            else if (_Var11 == '\r') {
              pvVar24 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                         *)QPDF::resolve(*(QPDF **)((long)&__v[1].
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  ._M_u + 0x10),
                                         *(QPDFObjGen *)
                                          ((long)&__v[1].
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  ._M_u + 0x18));
              goto LAB_001ef0bd;
            }
            if (_Var11 != '\x02') {
              ::qpdf::pl::Count::write
                        (((this->m).
                          super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->pipeline,(int)local_2d0,local_2c8,(size_t)psVar21);
              peVar20 = (this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (peVar20->qdf_mode == true) {
                ::qpdf::pl::Count::write(peVar20->pipeline,0x27f2bc,(void *)0x2,(size_t)psVar21);
              }
              ::qpdf::Name::normalize(&local_3c8,(string *)(p_Var25 + 1));
              ::qpdf::pl::Count::write
                        (((this->m).
                          super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->pipeline,(int)local_3c8._M_dataplus._M_p,
                         (void *)CONCAT44(local_3c8._M_string_length._4_4_,
                                          (uint)local_3c8._M_string_length),(size_t)psVar21);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                operator_delete(local_3c8._M_dataplus._M_p,
                                local_3c8.field_2._M_allocated_capacity + 1);
              }
              ::qpdf::pl::Count::write
                        (((this->m).
                          super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->pipeline,0x280dce,(void *)0x1,(size_t)psVar21);
              iVar13 = std::__cxx11::string::compare((char *)(p_Var25 + 1));
              if (iVar13 == 0) {
                local_368._0_8_ = (element_type *)local_358;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"/Sig","");
                local_348._16_8_ = &local_328;
                std::__cxx11::string::_M_construct<char_const*>((string *)(local_348 + 0x10),"");
                bVar9 = QPDFObjectHandle::isDictionaryOfType
                                  ((QPDFObjectHandle *)local_3a8,(string *)local_368,
                                   (string *)(local_348 + 0x10));
                if (!bVar9) goto LAB_001ef230;
                local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1d0,"/ByteRange","");
                bVar10 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_3a8,&local_1d0);
                bVar9 = true;
              }
              else {
LAB_001ef230:
                bVar9 = false;
                bVar10 = false;
              }
              if ((bVar9) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2)) {
                operator_delete(local_1d0._M_dataplus._M_p,
                                local_1d0.field_2._M_allocated_capacity + 1);
              }
              if (iVar13 == 0) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._16_8_ != &local_328) {
                  operator_delete((void *)local_348._16_8_,local_328._M_allocated_capacity + 1);
                }
                if ((element_type *)local_368._0_8_ != (element_type *)local_358) {
                  operator_delete((void *)local_368._0_8_,local_358._0_8_ + 1);
                }
              }
              peVar28 = *(element_type **)(p_Var25 + 2);
              if (bVar10 == false) {
                local_b0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var25[2]._M_parent;
                if ((_Base_ptr)
                    local_b0.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Base_ptr)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&((_Base_ptr)
                             local_b0.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_M_parent =
                         *(int *)&((_Base_ptr)
                                  local_b0.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_parent + 1;
                    UNLOCK();
                  }
                  else {
                    *(int *)&((_Base_ptr)
                             local_b0.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_M_parent =
                         *(int *)&((_Base_ptr)
                                  local_b0.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_parent + 1;
                  }
                }
                psVar21 = (string *)(ulong)local_314;
                local_b0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar28;
                unparseChild(this,&local_b0,(int)local_370,local_314);
                this_02._M_pi =
                     local_b0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              }
              else {
                local_a0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var25[2]._M_parent;
                if ((_Base_ptr)
                    local_a0.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Base_ptr)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&((_Base_ptr)
                             local_a0.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_M_parent =
                         *(int *)&((_Base_ptr)
                                  local_a0.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_parent + 1;
                    UNLOCK();
                  }
                  else {
                    *(int *)&((_Base_ptr)
                             local_a0.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_M_parent =
                         *(int *)&((_Base_ptr)
                                  local_a0.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_parent + 1;
                  }
                }
                psVar21 = (string *)(ulong)local_168;
                local_a0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar28;
                unparseChild(this,&local_a0,(int)local_370,local_168);
                this_02._M_pi =
                     local_a0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              }
              if ((_Base_ptr)this_02._M_pi != (_Base_ptr)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
              }
            }
          }
          p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25);
        } while (p_Var25 != p_Var39);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
      }
      uVar32 = local_39c;
      if ((local_39c & 1) != 0) {
        ::qpdf::pl::Count::write
                  (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->pipeline,(int)local_2d0,local_2c8,(size_t)psVar21);
        peVar20 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        if (peVar20->qdf_mode == true) {
          ::qpdf::pl::Count::write(peVar20->pipeline,0x27f2bc,(void *)0x2,(size_t)psVar21);
        }
        ::qpdf::pl::Count::write
                  (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->pipeline,0x2807d1,(void *)0x8,(size_t)psVar21);
        peVar20 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        if (peVar20->direct_stream_lengths == true) {
          cVar34 = '\x01';
          if ((string *)0x9 < local_1b0) {
            psVar21 = local_1b0;
            cVar7 = '\x04';
            do {
              cVar34 = cVar7;
              if (psVar21 < (string *)0x64) {
                cVar34 = cVar34 + -2;
                goto LAB_001ef4d4;
              }
              if (psVar21 < (string *)0x3e8) {
                cVar34 = cVar34 + -1;
                goto LAB_001ef4d4;
              }
              if (psVar21 < (string *)0x2710) goto LAB_001ef4d4;
              psVar31 = (string *)((ulong)psVar21 / 10000);
              bVar9 = (string *)0x1869f < psVar21;
              psVar21 = psVar31;
              cVar7 = cVar34 + '\x04';
            } while (bVar9);
            cVar34 = cVar34 + '\x01';
          }
LAB_001ef4d4:
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_3c8,cVar34);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_3c8._M_dataplus._M_p,(uint)local_3c8._M_string_length,
                     (unsigned_long)local_1b0);
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,(int)local_3c8._M_dataplus._M_p,
                     (void *)CONCAT44(local_3c8._M_string_length._4_4_,
                                      (uint)local_3c8._M_string_length),(size_t)psVar21);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          uVar32 = peVar20->cur_stream_length_id;
          uVar4 = -uVar32;
          if (0 < (int)uVar32) {
            uVar4 = uVar32;
          }
          uVar33 = 1;
          if (9 < uVar4) {
            psVar21 = (string *)(ulong)uVar4;
            uVar6 = 4;
            do {
              uVar33 = uVar6;
              uVar27 = (uint)psVar21;
              if (uVar27 < 100) {
                uVar33 = uVar33 - 2;
                goto LAB_001ef543;
              }
              if (uVar27 < 1000) {
                uVar33 = uVar33 - 1;
                goto LAB_001ef543;
              }
              if (uVar27 < 10000) goto LAB_001ef543;
              psVar21 = (string *)((ulong)psVar21 / 10000);
              uVar6 = uVar33 + 4;
            } while (99999 < uVar27);
            uVar33 = uVar33 + 1;
          }
LAB_001ef543:
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_3c8,(char)uVar33 - (char)((int)uVar32 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3c8._M_dataplus._M_p + (uVar32 >> 0x1f),uVar33,uVar4);
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,(int)local_3c8._M_dataplus._M_p,
                     (void *)CONCAT44(local_3c8._M_string_length._4_4_,
                                      (uint)local_3c8._M_string_length),(size_t)psVar21);
          uVar32 = local_39c;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,0x28291c,(void *)0x4,(size_t)psVar21);
        }
        bVar26 = (byte)local_164 ^ 1 | (uVar32 & 2) == 0;
        psVar21 = (string *)(ulong)CONCAT31((int3)((uint)local_164 >> 8),bVar26);
        if (bVar26 == 0) {
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,(int)local_2d0,local_2c8,(size_t)psVar21);
          peVar20 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          if (peVar20->qdf_mode == true) {
            ::qpdf::pl::Count::write(peVar20->pipeline,0x27f2bc,(void *)0x2,(size_t)psVar21);
          }
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,0x280de0,(void *)0x14,(size_t)psVar21);
        }
      }
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_2d0,local_2c8,(size_t)psVar21);
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x280fcf,(void *)0x2,(size_t)psVar21);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_);
      }
      goto LAB_001ef68b;
    case ot_stream:
      peVar20 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if (peVar20->direct_stream_lengths == false) {
        uVar35 = (ulong)iVar13;
        lVar3 = *(long *)&(peVar20->obj).super_ObjTable<QPDFWriter::Object>.
                          super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                          super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                          ._M_impl;
        uVar30 = ((long)*(pointer *)
                         ((long)&(peVar20->obj).super_ObjTable<QPDFWriter::Object>.
                                 super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                 .
                                 super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                         + 8) - lVar3 >> 2) * -0x5555555555555555;
        if (uVar30 < uVar35 || uVar30 - uVar35 == 0) {
          pOVar16 = ObjTable<QPDFWriter::Object>::large_element
                              (&(peVar20->obj).super_ObjTable<QPDFWriter::Object>,uVar35);
        }
        else {
          pOVar16 = (Object *)(lVar3 + uVar35 * 0xc);
        }
        ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        cur_stream_length_id = pOVar16->renumber + 1;
      }
      local_2f0._M_dataplus._M_p = local_2f0._M_dataplus._M_p & 0xffffffffffffff00;
      local_310.val._M_dataplus._M_p = local_310.val._M_dataplus._M_p & 0xffffffffffffff00;
      local_278._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_268._0_8_ = local_268._0_8_ & 0xffffffffffffff00;
      local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (((BaseHandle *)&local_3a8->_M_dataplus)->obj).
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_3a8->_M_string_length)->_M_pi;
      if (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_c0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_c0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      local_278._0_8_ = (element_type *)(local_278 + 0x10);
      bVar9 = willFilterStream(this,&local_c0,(bool *)&local_2f0,(bool *)&local_310,
                               (string *)local_278);
      if (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      QPDFObjectHandle::getDict((QPDFObjectHandle *)local_2b0);
      peVar20 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      peVar20->cur_stream_length = local_278._8_8_;
      if (((local_310.val._M_dataplus._M_p._0_1_ == (string)0x1) && (peVar20->encrypted == true)) &&
         (peVar20->encrypt_metadata == false)) {
        (peVar20->cur_data_key)._M_string_length = 0;
        *(peVar20->cur_data_key)._M_dataplus._M_p = '\0';
      }
      peVar20 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if (((peVar20->encrypted == true) && ((peVar20->cur_data_key)._M_string_length != 0)) &&
         (peVar20->encrypt_use_aes == true)) {
        peVar20->cur_stream_length = (peVar20->cur_stream_length & 0xfffffffffffffff0) + 0x20;
      }
      uVar32 = (uint)bVar9 * 2 | flags | 1;
      peVar28 = (element_type *)(ulong)uVar32;
      local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_2b0._0_8_;
      local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_2b0._8_8_ + 8) = *(_Atomic_word *)(local_2b0._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_2b0._8_8_ + 8) = *(_Atomic_word *)(local_2b0._8_8_ + 8) + 1;
        }
      }
      unparseObject(this,&local_d0,0,uVar32,
                    ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->cur_stream_length,local_2f0._M_dataplus._M_p._0_1_);
      if (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar9 = true;
      }
      else {
        bVar9 = ((char *)(local_278._0_8_ - 1))[local_278._8_8_] != '\n';
        peVar28 = (element_type *)local_278._0_8_;
      }
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x280f4e,(void *)0x8,(size_t)peVar28);
      local_398._M_string_length = 0;
      local_398._M_dataplus._M_p = (pointer)this;
      pushEncryptionFilter(this,(PipelinePopper *)&local_398);
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_278._0_8_,(void *)local_278._8_8_,(size_t)peVar28);
      PipelinePopper::~PipelinePopper((PipelinePopper *)&local_398);
      peVar20 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if ((peVar20->newline_before_endstream == false) && ((bVar9 & peVar20->qdf_mode) != 1)) {
        __n = 0;
      }
      else {
        ::qpdf::pl::Count::write(peVar20->pipeline,0x280f2f,(void *)0x1,(size_t)peVar28);
        peVar20 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        __n = CONCAT71((int7)((ulong)peVar28 >> 8),1);
      }
      peVar20->added_newline = SUB81(__n,0);
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x280fe7,(void *)0x9,__n);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_);
      }
      uVar30 = local_268._0_8_;
      _Var37._M_p = (pointer)local_278._0_8_;
      if ((element_type *)local_278._0_8_ == (element_type *)(local_278 + 0x10)) goto LAB_001ef68b;
    }
  }
  else {
switchD_001ed52f_caseD_7:
    QPDFObjectHandle::unparseResolved_abi_cxx11_((string *)local_278,(QPDFObjectHandle *)local_3a8);
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,(int)local_278._0_8_,(void *)local_278._8_8_,(size_t)indata);
    uVar30 = local_268._0_8_;
    _Var37._M_p = (pointer)local_278._0_8_;
    if ((element_type *)local_278._0_8_ == (element_type *)(local_278 + 0x10)) goto LAB_001ef68b;
  }
  operator_delete(_Var37._M_p,uVar30 + 1);
LAB_001ef68b:
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0,local_2c0[0] + 1);
  }
  return;
}

Assistant:

void
QPDFWriter::unparseObject(
    QPDFObjectHandle object, int level, int flags, size_t stream_length, bool compress)
{
    QPDFObjGen old_og = object.getObjGen();
    int child_flags = flags & ~f_stream;
    if (level < 0) {
        throw std::logic_error("invalid level in QPDFWriter::unparseObject");
    }
    // For non-qdf, "indent" is a single space between tokens. For qdf, indent includes the
    // preceding newline.
    std::string indent = " ";
    if (m->qdf_mode) {
        indent.append(static_cast<size_t>(2 * level), ' ');
        indent[0] = '\n';
    }

    if (auto const tc = object.getTypeCode(); tc == ::ot_array) {
        // Note: PDF spec 1.4 implementation note 121 states that Acrobat requires a space after the
        // [ in the /H key of the linearization parameter dictionary.  We'll do this unconditionally
        // for all arrays because it looks nicer and doesn't make the files that much bigger.
        writeString("[");
        for (auto const& item: object.as_array()) {
            writeString(indent);
            writeStringQDF("  ");
            unparseChild(item, level + 1, child_flags);
        }
        writeString(indent);
        writeString("]");
    } else if (tc == ::ot_dictionary) {
        // Make a shallow copy of this object so we can modify it safely without affecting the
        // original. This code has logic to skip certain keys in agreement with prepareFileForWrite
        // and with skip_stream_parameters so that replacing them doesn't leave unreferenced objects
        // in the output. We can use unsafeShallowCopy here because all we are doing is removing or
        // replacing top-level keys.
        object = object.unsafeShallowCopy();

        // Handle special cases for specific dictionaries.

        // Extensions dictionaries.

        // We have one of several cases:
        //
        // * We need ADBE
        //    - We already have Extensions
        //       - If it has the right ADBE, preserve it
        //       - Otherwise, replace ADBE
        //    - We don't have Extensions: create one from scratch
        // * We don't want ADBE
        //    - We already have Extensions
        //       - If it only has ADBE, remove it
        //       - If it has other things, keep those and remove ADBE
        //    - We have no extensions: no action required
        //
        // Before writing, we guarantee that /Extensions, if present, is direct through the ADBE
        // dictionary, so we can modify in place.

        const bool is_root = (old_og == m->root_og);
        bool have_extensions_other = false;
        bool have_extensions_adbe = false;

        QPDFObjectHandle extensions;
        if (is_root) {
            if (object.hasKey("/Extensions") && object.getKey("/Extensions").isDictionary()) {
                extensions = object.getKey("/Extensions");
            }
        }

        if (extensions) {
            std::set<std::string> keys = extensions.getKeys();
            if (keys.count("/ADBE") > 0) {
                have_extensions_adbe = true;
                keys.erase("/ADBE");
            }
            if (keys.size() > 0) {
                have_extensions_other = true;
            }
        }

        bool need_extensions_adbe = (m->final_extension_level > 0);

        if (is_root) {
            if (need_extensions_adbe) {
                if (!(have_extensions_other || have_extensions_adbe)) {
                    // We need Extensions and don't have it.  Create it here.
                    QTC::TC("qpdf", "QPDFWriter create Extensions", m->qdf_mode ? 0 : 1);
                    extensions = object.replaceKeyAndGetNew(
                        "/Extensions", QPDFObjectHandle::newDictionary());
                }
            } else if (!have_extensions_other) {
                // We have Extensions dictionary and don't want one.
                if (have_extensions_adbe) {
                    QTC::TC("qpdf", "QPDFWriter remove existing Extensions");
                    object.removeKey("/Extensions");
                    extensions = QPDFObjectHandle(); // uninitialized
                }
            }
        }

        if (extensions) {
            QTC::TC("qpdf", "QPDFWriter preserve Extensions");
            QPDFObjectHandle adbe = extensions.getKey("/ADBE");
            if (adbe.isDictionary() &&
                adbe.getKey("/BaseVersion").isNameAndEquals("/" + m->final_pdf_version) &&
                adbe.getKey("/ExtensionLevel").isInteger() &&
                (adbe.getKey("/ExtensionLevel").getIntValue() == m->final_extension_level)) {
                QTC::TC("qpdf", "QPDFWriter preserve ADBE");
            } else {
                if (need_extensions_adbe) {
                    extensions.replaceKey(
                        "/ADBE",
                        QPDFObjectHandle::parse(
                            "<< /BaseVersion /" + m->final_pdf_version + " /ExtensionLevel " +
                            std::to_string(m->final_extension_level) + " >>"));
                } else {
                    QTC::TC("qpdf", "QPDFWriter remove ADBE");
                    extensions.removeKey("/ADBE");
                }
            }
        }

        // Stream dictionaries.

        if (flags & f_stream) {
            // Suppress /Length since we will write it manually
            object.removeKey("/Length");

            // If /DecodeParms is an empty list, remove it.
            if (object.getKey("/DecodeParms").isArray() &&
                (0 == object.getKey("/DecodeParms").getArrayNItems())) {
                QTC::TC("qpdf", "QPDFWriter remove empty DecodeParms");
                object.removeKey("/DecodeParms");
            }

            if (flags & f_filtered) {
                // We will supply our own filter and decode
                // parameters.
                object.removeKey("/Filter");
                object.removeKey("/DecodeParms");
            } else {
                // Make sure, no matter what else we have, that we don't have /Crypt in the output
                // filters.
                QPDFObjectHandle filter = object.getKey("/Filter");
                QPDFObjectHandle decode_parms = object.getKey("/DecodeParms");
                if (filter.isOrHasName("/Crypt")) {
                    if (filter.isName()) {
                        object.removeKey("/Filter");
                        object.removeKey("/DecodeParms");
                    } else {
                        int idx = -1;
                        for (int i = 0; i < filter.getArrayNItems(); ++i) {
                            QPDFObjectHandle item = filter.getArrayItem(i);
                            if (item.isNameAndEquals("/Crypt")) {
                                idx = i;
                                break;
                            }
                        }
                        if (idx >= 0) {
                            // If filter is an array, then the code in QPDF_Stream has already
                            // verified that DecodeParms and Filters are arrays of the same length,
                            // but if they weren't for some reason, eraseItem does type and bounds
                            // checking.
                            QTC::TC("qpdf", "QPDFWriter remove Crypt");
                            filter.eraseItem(idx);
                            decode_parms.eraseItem(idx);
                        }
                    }
                }
            }
        }

        writeString("<<");

        for (auto const& [key, value]: object.as_dictionary()) {
            if (!value.null()) {
                writeString(indent);
                writeStringQDF("  ");
                writeString(Name::normalize(key));
                writeString(" ");
                if (key == "/Contents" && object.isDictionaryOfType("/Sig") &&
                    object.hasKey("/ByteRange")) {
                    QTC::TC("qpdf", "QPDFWriter no encryption sig contents");
                    unparseChild(value, level + 1, child_flags | f_hex_string | f_no_encryption);
                } else {
                    unparseChild(value, level + 1, child_flags);
                }
            }
        }

        if (flags & f_stream) {
            writeString(indent);
            writeStringQDF("  ");
            writeString("/Length ");

            if (m->direct_stream_lengths) {
                writeString(std::to_string(stream_length));
            } else {
                writeString(std::to_string(m->cur_stream_length_id));
                writeString(" 0 R");
            }
            if (compress && (flags & f_filtered)) {
                writeString(indent);
                writeStringQDF("  ");
                writeString("/Filter /FlateDecode");
            }
        }

        writeString(indent);
        writeString(">>");
    } else if (tc == ::ot_stream) {
        // Write stream data to a buffer.
        if (!m->direct_stream_lengths) {
            m->cur_stream_length_id = m->obj[old_og].renumber + 1;
        }

        flags |= f_stream;
        bool compress_stream = false;
        bool is_metadata = false;
        std::string stream_data;
        if (willFilterStream(object, compress_stream, is_metadata, &stream_data)) {
            flags |= f_filtered;
        }
        QPDFObjectHandle stream_dict = object.getDict();

        m->cur_stream_length = stream_data.size();
        if (is_metadata && m->encrypted && (!m->encrypt_metadata)) {
            // Don't encrypt stream data for the metadata stream
            m->cur_data_key.clear();
        }
        adjustAESStreamLength(m->cur_stream_length);
        unparseObject(stream_dict, 0, flags, m->cur_stream_length, compress_stream);
        char last_char = stream_data.empty() ? '\0' : stream_data.back();
        writeString("\nstream\n");
        {
            PipelinePopper pp_enc(this);
            pushEncryptionFilter(pp_enc);
            writeString(stream_data);
        }

        if (m->newline_before_endstream || (m->qdf_mode && last_char != '\n')) {
            writeString("\n");
            m->added_newline = true;
        } else {
            m->added_newline = false;
        }
        writeString("endstream");
    } else if (tc == ::ot_string) {
        std::string val;
        if (m->encrypted && (!(flags & f_in_ostream)) && (!(flags & f_no_encryption)) &&
            (!m->cur_data_key.empty())) {
            val = object.getStringValue();
            if (m->encrypt_use_aes) {
                Pl_Buffer bufpl("encrypted string");
                Pl_AES_PDF pl(
                    "aes encrypt string",
                    &bufpl,
                    true,
                    QUtil::unsigned_char_pointer(m->cur_data_key),
                    m->cur_data_key.length());
                pl.writeString(val);
                pl.finish();
                val = QPDF_String(bufpl.getString()).unparse(true);
            } else {
                auto tmp_ph = QUtil::make_unique_cstr(val);
                char* tmp = tmp_ph.get();
                size_t vlen = val.length();
                RC4 rc4(
                    QUtil::unsigned_char_pointer(m->cur_data_key),
                    QIntC::to_int(m->cur_data_key.length()));
                auto data = QUtil::unsigned_char_pointer(tmp);
                rc4.process(data, vlen, data);
                val = QPDF_String(std::string(tmp, vlen)).unparse();
            }
        } else if (flags & f_hex_string) {
            val = QPDF_String(object.getStringValue()).unparse(true);
        } else {
            val = object.unparseResolved();
        }
        writeString(val);
    } else {
        writeString(object.unparseResolved());
    }
}